

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

DefinitionSymbol * __thiscall
slang::ast::Compilation::getDefinition
          (Compilation *this,Scope *scope,ModuleDeclarationSyntax *syntax)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  value_type_pointer ppVar4;
  DefinitionSymbol *pDVar5;
  RootSymbol *pRVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  value_type_pointer ppVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long *plVar16;
  Scope *pSVar17;
  value_type *elements_1;
  ulong uVar18;
  ulong uVar19;
  value_type *elements;
  pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*> *ppVar20;
  ulong uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  byte bVar25;
  byte bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Scope *insertScope;
  SmallMap<const_slang::ast::Scope_*,_const_slang::ast::DefinitionSymbol_*,_4UL,_std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
  scopeMap;
  locator res;
  try_emplace_args_t local_129;
  Scope *local_128;
  Scope *local_120;
  Compilation *local_118;
  long *local_110;
  undefined1 local_108 [72];
  allocator_type local_c0;
  arrays_type local_b8;
  undefined1 local_98 [16];
  locator local_80;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  auVar8._8_8_ = 0;
  auVar8._0_8_ = syntax;
  uVar14 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar12 = uVar14 >> ((byte)(this->definitionFromSyntax).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar14 & 0xff];
  ppVar4 = (this->definitionFromSyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
           .arrays.elements_;
  uVar19 = (this->definitionFromSyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
           .arrays.groups_size_mask;
  uVar18 = 0;
  do {
    pgVar1 = (this->definitionFromSyntax).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
             .arrays.groups_ + uVar12;
    local_48 = pgVar1->m[0].n;
    uStack_47 = pgVar1->m[1].n;
    uStack_46 = pgVar1->m[2].n;
    bStack_45 = pgVar1->m[3].n;
    uStack_44 = pgVar1->m[4].n;
    uStack_43 = pgVar1->m[5].n;
    uStack_42 = pgVar1->m[6].n;
    bStack_41 = pgVar1->m[7].n;
    uStack_40 = pgVar1->m[8].n;
    uStack_3f = pgVar1->m[9].n;
    uStack_3e = pgVar1->m[10].n;
    bStack_3d = pgVar1->m[0xb].n;
    uStack_3c = pgVar1->m[0xc].n;
    uStack_3b = pgVar1->m[0xd].n;
    uStack_3a = pgVar1->m[0xe].n;
    bStack_39 = pgVar1->m[0xf].n;
    uVar22 = (uchar)uVar3;
    auVar27[0] = -(local_48 == uVar22);
    uVar23 = (uchar)((uint)uVar3 >> 8);
    auVar27[1] = -(uStack_47 == uVar23);
    uVar24 = (uchar)((uint)uVar3 >> 0x10);
    auVar27[2] = -(uStack_46 == uVar24);
    bVar25 = (byte)((uint)uVar3 >> 0x18);
    auVar27[3] = -(bStack_45 == bVar25);
    auVar27[4] = -(uStack_44 == uVar22);
    auVar27[5] = -(uStack_43 == uVar23);
    auVar27[6] = -(uStack_42 == uVar24);
    auVar27[7] = -(bStack_41 == bVar25);
    auVar27[8] = -(uStack_40 == uVar22);
    auVar27[9] = -(uStack_3f == uVar23);
    auVar27[10] = -(uStack_3e == uVar24);
    auVar27[0xb] = -(bStack_3d == bVar25);
    auVar27[0xc] = -(uStack_3c == uVar22);
    auVar27[0xd] = -(uStack_3b == uVar23);
    auVar27[0xe] = -(uStack_3a == uVar24);
    auVar27[0xf] = -(bStack_39 == bVar25);
    for (uVar15 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe); uVar15 != 0;
        uVar15 = uVar15 - 1 & uVar15) {
      iVar7 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
        }
      }
      uVar21 = (ulong)(uint)(iVar7 << 5);
      if (*(ModuleDeclarationSyntax **)((long)&ppVar4[uVar12 * 0xf].first + uVar21) == syntax) {
        local_108._64_8_ = local_108;
        local_b8.groups_size_index = 0x3f;
        local_b8.groups_size_mask = 1;
        local_b8.elements_ = (value_type_pointer)0x0;
        ppVar11 = local_b8.elements_;
        local_b8.groups_ =
             (group_type_pointer)
             boost::unordered::detail::foa::
             dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
             ::storage;
        local_b8.elements_ = (value_type_pointer)0x0;
        local_98 = (undefined1  [16])0x0;
        plVar16 = *(long **)((long)&ppVar4[uVar12 * 0xf].second.
                                    super__Vector_base<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar21);
        local_110 = *(long **)((long)&ppVar4[uVar12 * 0xf].second.
                                      super__Vector_base<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + uVar21);
        local_120 = scope;
        local_118 = this;
        local_c0.storage = (Storage *)local_108._64_8_;
        if (plVar16 != local_110) goto LAB_003ce9d9;
        bVar25 = 0x3f;
        local_b8.elements_ = ppVar11;
        goto LAB_003cebb0;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7] & bStack_39) == 0) {
      return (DefinitionSymbol *)0x0;
    }
    lVar13 = uVar12 + uVar18;
    uVar18 = uVar18 + 1;
    uVar12 = lVar13 + 1U & uVar19;
    if (uVar19 < uVar18) {
      return (DefinitionSymbol *)0x0;
    }
  } while( true );
LAB_003ce9d9:
  do {
    pDVar5 = (DefinitionSymbol *)*plVar16;
    local_128 = (pDVar5->super_Symbol).parentScope;
    if (local_128 == (Scope *)0x0) {
      pSVar17 = (Scope *)0x0;
    }
    else {
      pSVar17 = local_128;
      if ((local_128->thisSym->kind == CompilationUnit) &&
         (pRVar6 = (local_118->root)._M_t.
                   super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                   .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl,
         pSVar17 = &pRVar6->super_Scope, local_128 = pSVar17, pRVar6 == (RootSymbol *)0x0)) {
        pSVar17 = (Scope *)0x0;
        local_128 = pSVar17;
      }
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = pSVar17;
    uVar14 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar12 = uVar14 >> ((byte)local_b8.groups_size_index & 0x3f);
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar14 & 0xff];
    uVar18 = 0;
    uVar19 = uVar12;
    do {
      pgVar2 = local_b8.groups_ + uVar19;
      local_58 = pgVar2->m[0].n;
      uStack_57 = pgVar2->m[1].n;
      uStack_56 = pgVar2->m[2].n;
      bStack_55 = pgVar2->m[3].n;
      uStack_54 = pgVar2->m[4].n;
      uStack_53 = pgVar2->m[5].n;
      uStack_52 = pgVar2->m[6].n;
      bStack_51 = pgVar2->m[7].n;
      uStack_50 = pgVar2->m[8].n;
      uStack_4f = pgVar2->m[9].n;
      uStack_4e = pgVar2->m[10].n;
      bStack_4d = pgVar2->m[0xb].n;
      uStack_4c = pgVar2->m[0xc].n;
      uStack_4b = pgVar2->m[0xd].n;
      uStack_4a = pgVar2->m[0xe].n;
      bStack_49 = pgVar2->m[0xf].n;
      uVar22 = (uchar)uVar3;
      auVar28[0] = -(local_58 == uVar22);
      uVar23 = (uchar)((uint)uVar3 >> 8);
      auVar28[1] = -(uStack_57 == uVar23);
      uVar24 = (uchar)((uint)uVar3 >> 0x10);
      auVar28[2] = -(uStack_56 == uVar24);
      bVar25 = (byte)((uint)uVar3 >> 0x18);
      auVar28[3] = -(bStack_55 == bVar25);
      auVar28[4] = -(uStack_54 == uVar22);
      auVar28[5] = -(uStack_53 == uVar23);
      auVar28[6] = -(uStack_52 == uVar24);
      auVar28[7] = -(bStack_51 == bVar25);
      auVar28[8] = -(uStack_50 == uVar22);
      auVar28[9] = -(uStack_4f == uVar23);
      auVar28[10] = -(uStack_4e == uVar24);
      auVar28[0xb] = -(bStack_4d == bVar25);
      auVar28[0xc] = -(uStack_4c == uVar22);
      auVar28[0xd] = -(uStack_4b == uVar23);
      auVar28[0xe] = -(uStack_4a == uVar24);
      auVar28[0xf] = -(bStack_49 == bVar25);
      for (uVar15 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe); uVar15 != 0;
          uVar15 = uVar15 - 1 & uVar15) {
        iVar7 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
          }
        }
        if (pSVar17 ==
            *(Scope **)((long)&local_b8.elements_[uVar19 * 0xf].first + (ulong)(uint)(iVar7 << 4)))
        {
          ppVar20 = (pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*> *)
                    ((long)&local_b8.elements_[uVar19 * 0xf].first + (ulong)(uint)(iVar7 << 4));
          goto LAB_003ceb3e;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7] & bStack_49) == 0) break;
      lVar13 = uVar19 + uVar18;
      uVar18 = uVar18 + 1;
      uVar19 = lVar13 + 1U & local_b8.groups_size_mask;
    } while (uVar18 <= local_b8.groups_size_mask);
    if ((ulong)local_98._8_8_ < (ulong)local_98._0_8_) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Scope_const*const,slang::ast::DefinitionSymbol_const*>,64ul,16ul>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Scope_const*const&>
                (&local_80,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Scope_const*const,slang::ast::DefinitionSymbol_const*>,64ul,16ul>>
                  *)&local_c0,&local_b8,uVar12,uVar14,&local_129,&local_128);
      local_98._8_8_ = local_98._8_8_ + 1;
      ppVar20 = local_80.p;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Scope_const*const,slang::ast::DefinitionSymbol_const*>,64ul,16ul>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Scope_const*const&>
                (&local_80,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Scope_const*const,slang::ast::DefinitionSymbol_const*>,64ul,16ul>>
                  *)&local_c0,uVar14,&local_129,&local_128);
      ppVar20 = local_80.p;
    }
LAB_003ceb3e:
    ppVar20->second = pDVar5;
    plVar16 = plVar16 + 1;
  } while (plVar16 != local_110);
  bVar25 = (byte)local_b8.groups_size_index;
  scope = local_120;
LAB_003cebb0:
  do {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = scope;
    uVar12 = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar19 = uVar12 >> (bVar25 & 0x3f);
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar12 & 0xff];
    uVar14 = 0;
    do {
      pgVar2 = local_b8.groups_ + uVar19;
      local_68 = pgVar2->m[0].n;
      uStack_67 = pgVar2->m[1].n;
      uStack_66 = pgVar2->m[2].n;
      bStack_65 = pgVar2->m[3].n;
      uStack_64 = pgVar2->m[4].n;
      uStack_63 = pgVar2->m[5].n;
      uStack_62 = pgVar2->m[6].n;
      bStack_61 = pgVar2->m[7].n;
      uStack_60 = pgVar2->m[8].n;
      uStack_5f = pgVar2->m[9].n;
      uStack_5e = pgVar2->m[10].n;
      bStack_5d = pgVar2->m[0xb].n;
      uStack_5c = pgVar2->m[0xc].n;
      uStack_5b = pgVar2->m[0xd].n;
      uStack_5a = pgVar2->m[0xe].n;
      bStack_59 = pgVar2->m[0xf].n;
      uVar22 = (uchar)uVar3;
      auVar29[0] = -(local_68 == uVar22);
      uVar23 = (uchar)((uint)uVar3 >> 8);
      auVar29[1] = -(uStack_67 == uVar23);
      uVar24 = (uchar)((uint)uVar3 >> 0x10);
      auVar29[2] = -(uStack_66 == uVar24);
      bVar26 = (byte)((uint)uVar3 >> 0x18);
      auVar29[3] = -(bStack_65 == bVar26);
      auVar29[4] = -(uStack_64 == uVar22);
      auVar29[5] = -(uStack_63 == uVar23);
      auVar29[6] = -(uStack_62 == uVar24);
      auVar29[7] = -(bStack_61 == bVar26);
      auVar29[8] = -(uStack_60 == uVar22);
      auVar29[9] = -(uStack_5f == uVar23);
      auVar29[10] = -(uStack_5e == uVar24);
      auVar29[0xb] = -(bStack_5d == bVar26);
      auVar29[0xc] = -(uStack_5c == uVar22);
      auVar29[0xd] = -(uStack_5b == uVar23);
      auVar29[0xe] = -(uStack_5a == uVar24);
      auVar29[0xf] = -(bStack_59 == bVar26);
      for (uVar15 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe); uVar15 != 0;
          uVar15 = uVar15 - 1 & uVar15) {
        iVar7 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
          }
        }
        if (scope == *(Scope **)
                      ((long)&local_b8.elements_[uVar19 * 0xf].first + (ulong)(uint)(iVar7 << 4))) {
          pDVar5 = *(DefinitionSymbol **)
                    ((long)&local_b8.elements_[uVar19 * 0xf].second + (ulong)(uint)(iVar7 << 4));
          boost::unordered::detail::foa::
          table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
          ::delete_(local_c0,&local_b8);
          return pDVar5;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7] & bStack_59) == 0) break;
      lVar13 = uVar19 + uVar14;
      uVar14 = uVar14 + 1;
      uVar19 = lVar13 + 1U & local_b8.groups_size_mask;
    } while (uVar14 <= local_b8.groups_size_mask);
    scope = scope->thisSym->parentScope;
    if (scope == (Scope *)0x0) {
      boost::unordered::detail::foa::
      table_arrays<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::DefinitionSymbol_*>,_64UL,_16UL>_>
      ::delete_(local_c0,&local_b8);
      return (DefinitionSymbol *)0x0;
    }
  } while( true );
}

Assistant:

const DefinitionSymbol* Compilation::getDefinition(const Scope& scope,
                                                   const ModuleDeclarationSyntax& syntax) const {
    if (auto it = definitionFromSyntax.find(&syntax); it != definitionFromSyntax.end()) {
        SmallMap<const Scope*, const DefinitionSymbol*, 4> scopeMap;
        for (auto def : it->second) {
            auto insertScope = def->getParentScope();
            if (insertScope && insertScope->asSymbol().kind == SymbolKind::CompilationUnit)
                insertScope = root.get();

            scopeMap[insertScope] = def;
        }

        auto lookupScope = &scope;
        do {
            if (auto scopeIt = scopeMap.find(lookupScope); scopeIt != scopeMap.end())
                return scopeIt->second;

            lookupScope = lookupScope->asSymbol().getParentScope();
        } while (lookupScope);
    }
    return nullptr;
}